

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void parsetimeunits(void *x,t_float amount,t_symbol *unitname,t_float *unit,int *samps)

{
  char *__s1;
  int iVar1;
  char *__s1_00;
  char *s2;
  char *s;
  int *samps_local;
  t_float *unit_local;
  t_symbol *unitname_local;
  t_float amount_local;
  void *x_local;
  
  __s1 = unitname->s_name;
  unitname_local._4_4_ = amount;
  if (amount <= 0.0) {
    unitname_local._4_4_ = 1.0;
  }
  if (((*__s1 == 'p') && (__s1[1] == 'e')) && (__s1[2] == 'r')) {
    __s1_00 = __s1 + 3;
    iVar1 = strcmp(__s1_00,"millisecond");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1_00,"msec"), iVar1 == 0)) {
      *samps = 0;
      *unit = 1.0 / unitname_local._4_4_;
      return;
    }
    iVar1 = strncmp(__s1_00,"sec",3);
    if (iVar1 == 0) {
      *samps = 0;
      *unit = 1000.0 / unitname_local._4_4_;
      return;
    }
    iVar1 = strncmp(__s1_00,"min",3);
    if (iVar1 == 0) {
      *samps = 0;
      *unit = 60000.0 / unitname_local._4_4_;
      return;
    }
    iVar1 = strncmp(__s1_00,"sam",3);
    if (iVar1 == 0) {
      *samps = 1;
      *unit = 1.0 / unitname_local._4_4_;
      return;
    }
  }
  else {
    iVar1 = strcmp(__s1,"millisecond");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"msec"), iVar1 == 0)) {
      *samps = 0;
      *unit = unitname_local._4_4_;
      return;
    }
    iVar1 = strncmp(__s1,"sec",3);
    if (iVar1 == 0) {
      *samps = 0;
      *unit = unitname_local._4_4_ * 1000.0;
      return;
    }
    iVar1 = strncmp(__s1,"min",3);
    if (iVar1 == 0) {
      *samps = 0;
      *unit = unitname_local._4_4_ * 60000.0;
      return;
    }
    iVar1 = strncmp(__s1,"sam",3);
    if (iVar1 == 0) {
      *samps = 1;
      *unit = unitname_local._4_4_;
      return;
    }
  }
  if (*__s1 == '\0') {
    pd_error(x,"tempo setting needs time unit (\'sec\', \'samp\', \'permin\', etc.");
  }
  else {
    pd_error(x,"%s: unknown time unit",__s1);
  }
  *unit = 1.0;
  *samps = 0;
  return;
}

Assistant:

void parsetimeunits(void *x, t_float amount, t_symbol *unitname,
    t_float *unit, int *samps)
{
    const char *s = unitname->s_name;
    if (amount <= 0)
        amount = 1;
    if (s[0] == 'p' && s[1] == 'e' && s[2] == 'r')  /* starts with 'per' */
    {
        const char *s2 = s+3;
        if (!strcmp(s2, "millisecond") || !strcmp(s2, "msec"))  /* msec */
            *samps = 0, *unit = 1./amount;
        else if (!strncmp(s2, "sec", 3))        /* seconds */
            *samps = 0, *unit = 1000./amount;
        else if (!strncmp(s2, "min", 3))        /* minutes */
            *samps = 0, *unit = 60000./amount;
        else if (!strncmp(s2, "sam", 3))        /* samples */
            *samps = 1, *unit = 1./amount;
        else goto fail;
    }
    else
    {
            /* empty string defaults to msec */
        if (!strcmp(s, "millisecond") || !strcmp(s, "msec"))
            *samps = 0, *unit = amount;
        else if (!strncmp(s, "sec", 3))
            *samps = 0, *unit = 1000.*amount;
        else if (!strncmp(s, "min", 3))
            *samps = 0, *unit = 60000.*amount;
        else if (!strncmp(s, "sam", 3))
            *samps = 1, *unit = amount;
        else
        {
        fail:
                /* empty time unit specification defaults to 1 msec for
                back compatibility, since it's possible someone threw a
                float argument to timer which had previously been ignored. */
            if (*s)
                pd_error(x, "%s: unknown time unit", s);
            else pd_error(x,
                "tempo setting needs time unit ('sec', 'samp', 'permin', etc.");
            *unit = 1;
            *samps = 0;
        }
    }
}